

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

size_t Catch::listTests(Config *config)

{
  bool bVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  undefined8 *puVar4;
  ulong uVar5;
  ostream *poVar6;
  ulong uVar7;
  long lVar8;
  TestCase *pTVar9;
  char *pcVar10;
  Colour *this;
  string *this_00;
  pointer pcVar11;
  undefined8 uVar12;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *filters;
  TestCase *pTVar13;
  ulong uVar14;
  ulong uVar15;
  string nameCol;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  Config *local_108;
  TestCase *local_100;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *local_f8;
  ulong local_f0;
  pointer local_e8;
  Text tagsWrapper;
  Text nameWrapper;
  
  filters = &config->m_filterSets;
  pcVar10 = "Matching test cases:\n";
  if ((config->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (config->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar10 = "All available test cases:\n";
  }
  local_108 = config;
  std::operator<<((ostream *)&std::cout,pcVar10);
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[3])(pIVar3);
  puVar4 = (undefined8 *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
                     ((long *)CONCAT44(extraout_var,iVar2));
  pTVar9 = (TestCase *)puVar4[1];
  uVar14 = 0;
  uVar15 = 0;
  for (pTVar13 = (TestCase *)*puVar4; pTVar13 != pTVar9; pTVar13 = pTVar13 + 1) {
    bVar1 = matchesFilters(filters,pTVar13);
    if (bVar1) {
      uVar7 = (pTVar13->super_TestCaseInfo).name._M_string_length;
      uVar5 = (pTVar13->super_TestCaseInfo).tagsAsString._M_string_length;
      if (uVar15 < uVar5) {
        uVar15 = uVar5;
      }
      if (uVar14 < uVar7) {
        uVar14 = uVar7;
      }
    }
  }
  for (; 0x4b < uVar15 + uVar14; uVar15 = (uVar15 - 1) + (ulong)(uVar15 < 0x1f)) {
    uVar14 = uVar14 - (uVar15 < 0x1f);
  }
  pcVar11 = (pointer)0x0;
  local_100 = pTVar9;
  local_f8 = filters;
  local_f0 = uVar15;
  for (pTVar13 = (TestCase *)*puVar4; pTVar13 != pTVar9; pTVar13 = pTVar13 + 1) {
    bVar1 = matchesFilters(filters,pTVar13);
    if (bVar1) {
      tagsWrapper.str.field_2._M_local_buf[8] = '\t';
      tagsWrapper.str._M_dataplus._M_p = (pointer)0x2;
      tagsWrapper.str._M_string_length = 4;
      tagsWrapper.str.field_2._M_allocated_capacity = uVar14;
      Text::Text(&nameWrapper,(string *)pTVar13,(TextAttributes *)&tagsWrapper);
      nameCol.field_2._M_local_buf[8] = '\t';
      nameCol.field_2._M_allocated_capacity = local_f0;
      nameCol._M_dataplus._M_p = (pointer)0x0;
      nameCol._M_string_length = 2;
      Text::Text(&tagsWrapper,&(pTVar13->super_TestCaseInfo).tagsAsString,(TextAttributes *)&nameCol
                );
      local_e8 = pcVar11 + 1;
      lVar8 = 0;
      uVar15 = 0;
      while( true ) {
        uVar5 = (long)nameWrapper.lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)nameWrapper.lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        uVar7 = (long)tagsWrapper.lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)tagsWrapper.lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (uVar7 < uVar5) {
          uVar7 = uVar5;
        }
        if (uVar7 <= uVar15) break;
        nameCol._M_dataplus._M_p = (pointer)&nameCol.field_2;
        nameCol._M_string_length = 0;
        nameCol.field_2._M_allocated_capacity =
             nameCol.field_2._M_allocated_capacity & 0xffffffffffffff00;
        if (uVar15 < uVar5) {
          uVar12 = 0;
          if ((pTVar13->super_TestCaseInfo).isHidden != false) {
            uVar12 = 0x17;
          }
          std::__cxx11::string::_M_assign((string *)&nameCol);
        }
        else {
          std::__cxx11::string::assign((char *)&nameCol);
          uVar12 = 0x17;
        }
        (**(code **)(*Colour::impl + 0x10))(Colour::impl,uVar12);
        this = (Colour *)&std::cout;
        std::operator<<((ostream *)&std::cout,(string *)&nameCol);
        Colour::~Colour(this);
        if ((uVar15 < (ulong)((long)tagsWrapper.lines.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)tagsWrapper.lines.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5)) &&
           (*(long *)((long)&(tagsWrapper.lines.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar8)
            != 0)) {
          if (uVar15 == 0) {
            (**(code **)(*Colour::impl + 0x10))(Colour::impl,0x17);
            poVar6 = std::operator<<((ostream *)&std::cout,"  ");
            local_128[0] = local_118;
            std::__cxx11::string::_M_construct
                      ((ulong)local_128,(char)uVar14 - (char)nameCol._M_string_length);
            poVar6 = std::operator<<(poVar6,(string *)local_128);
            std::operator<<(poVar6,"  ");
            this_00 = (string *)local_128;
            std::__cxx11::string::~string(this_00);
            Colour::~Colour((Colour *)this_00);
          }
          else {
            local_128[0] = local_118;
            std::__cxx11::string::_M_construct
                      ((ulong)local_128,(char)uVar14 - (char)nameCol._M_string_length);
            poVar6 = std::operator<<((ostream *)&std::cout,(string *)local_128);
            std::operator<<(poVar6,"    ");
            std::__cxx11::string::~string((string *)local_128);
          }
          std::operator<<((ostream *)&std::cout,
                          (string *)
                          ((long)&((tagsWrapper.lines.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar8));
        }
        std::operator<<((ostream *)&std::cout,"\n");
        std::__cxx11::string::~string((string *)&nameCol);
        uVar15 = uVar15 + 1;
        lVar8 = lVar8 + 0x20;
      }
      Text::~Text(&tagsWrapper);
      Text::~Text(&nameWrapper);
      pTVar9 = local_100;
      pcVar11 = local_e8;
      filters = local_f8;
    }
  }
  nameWrapper.str._M_dataplus._M_p = pcVar11;
  if ((local_108->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (local_108->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&tagsWrapper,"test case",(allocator *)&nameCol);
    std::__cxx11::string::string((string *)&nameWrapper.str._M_string_length,(string *)&tagsWrapper)
    ;
    poVar6 = operator<<((ostream *)&std::cout,(pluralise *)&nameWrapper);
    poVar6 = std::operator<<(poVar6,"\n");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  else {
    std::__cxx11::string::string((string *)&tagsWrapper,"matching test case",(allocator *)&nameCol);
    std::__cxx11::string::string((string *)&nameWrapper.str._M_string_length,(string *)&tagsWrapper)
    ;
    poVar6 = operator<<((ostream *)&std::cout,(pluralise *)&nameWrapper);
    poVar6 = std::operator<<(poVar6,"\n");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::__cxx11::string::~string((string *)&nameWrapper.str._M_string_length);
  std::__cxx11::string::~string((string *)&tagsWrapper);
  return (size_t)pcVar11;
}

Assistant:

std::vector<TestCaseFilters> const& filters() const {
            return m_filterSets;
        }